

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial.c
# Opt level: O1

boolean check_tutorial_message(int msgnum)

{
  if ((flags.tutorial != '\0') && (*(char *)((long)container_obj + (long)msgnum + 0x37) < '\x01')) {
    *(undefined1 *)((long)container_obj + (long)msgnum + 0x37) = 1;
    if (msgnum < 0x108) {
      if (msgnum == 0xca) {
        pl_tutorial[2] = '\x01';
      }
      else if (msgnum == 0x105) {
        pl_tutorial[0x3b] = '\x01';
      }
    }
    else if (msgnum == 0x108) {
      pl_tutorial[0x3e] = '\x01';
    }
    else if (msgnum == 0x10a) {
      pl_tutorial[0x40] = '\x01';
    }
    tutorial_latest_message = msgnum;
    com_pager(msgnum);
    return '\x01';
  }
  return '\0';
}

Assistant:

boolean check_tutorial_message(int msgnum)
{
	if (!flags.tutorial) return FALSE;
	if (pl_tutorial[msgnum - QT_T_FIRST] > 0) return FALSE;

	pl_tutorial[msgnum - QT_T_FIRST] = 1;
	tutorial_latest_message = msgnum;

	/* Show matching vi-keys message in tutorial review menu
	   when a numpad tutorial message is shown. */
	switch (msgnum) {
	case QT_T_CURSOR_NUMPAD:
	    pl_tutorial[QT_T_CURSOR_VIKEYS - QT_T_FIRST] = 1;
	    break;
	case QT_T_FARMOVE_NUMPAD:
	    pl_tutorial[QT_T_FARMOVE_VIKEYS - QT_T_FIRST] = 1;
	    break;
	case QT_T_DIAGONALS_NUM:
	    pl_tutorial[QT_T_DIAGONALS_VI - QT_T_FIRST] = 1;
	    break;
	case QT_T_REPEAT_NUMPAD:
	    pl_tutorial[QT_T_REPEAT_VIKEYS - QT_T_FIRST] = 1;
	    break;
	}

	com_pager(msgnum);
	return TRUE;
}